

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

_Bool oonf_layer2_neigh_remove(oonf_layer2_neigh *l2neigh,oonf_layer2_origin *origin)

{
  _Bool _Var1;
  int iVar2;
  bool bVar3;
  list_entity *plVar4;
  list_entity *plVar5;
  
  if ((l2neigh->_node).list.next == (list_entity *)0x0) {
    return false;
  }
  if ((l2neigh->_node).list.prev != (list_entity *)0x0) {
    plVar4 = (l2neigh->destinations).list_head.next;
    bVar3 = false;
    do {
      do {
        plVar5 = plVar4;
        if (plVar5->prev == (l2neigh->destinations).list_head.prev) {
          plVar4 = (l2neigh->remote_neighbor_ips).list_head.next;
          while (plVar4->prev != (l2neigh->remote_neighbor_ips).list_head.prev) {
            plVar5 = plVar4->next;
            iVar2 = oonf_layer2_neigh_remove_ip
                              ((oonf_layer2_neighbor_address *)(plVar4 + -6),origin);
            bVar3 = (bool)(bVar3 | iVar2 == 0);
            plVar4 = plVar5;
          }
          _Var1 = oonf_layer2_neigh_cleanup(l2neigh,origin);
          if (!_Var1 && !bVar3) {
            return false;
          }
          oonf_layer2_neigh_commit(l2neigh);
          return true;
        }
        plVar4 = plVar5->next;
      } while ((oonf_layer2_origin *)plVar5[-1].prev != origin);
      oonf_layer2_destination_remove((oonf_layer2_destination *)&plVar5[-3].prev);
      bVar3 = true;
    } while( true );
  }
  return false;
}

Assistant:

static INLINE bool
list_is_node_added(const struct list_entity *node) {
  return node->next != NULL && node->prev != NULL;
}